

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_openssl.c
# Opt level: O0

int load_certificate_chain(SSL_CTX *ssl_ctx,char *certificate)

{
  int iVar1;
  BIO *bp;
  X509 *x;
  X509 *a;
  long lVar2;
  ulong errcode;
  unsigned_long err_value;
  X509 *ca_chain;
  X509 *x509_value;
  BIO *bio_cert;
  int result;
  char *certificate_local;
  SSL_CTX *ssl_ctx_local;
  
  bp = BIO_new_mem_buf(certificate,-1);
  if (bp == (BIO *)0x0) {
    log_ERR_get_error("cannot create BIO");
    bio_cert._4_4_ = 0x36;
  }
  else {
    x = PEM_read_bio_X509_AUX(bp,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
    if (x == (X509 *)0x0) {
      log_ERR_get_error("Failure PEM_read_bio_X509_AUX");
      bio_cert._4_4_ = 0x3e;
    }
    else {
      iVar1 = SSL_CTX_use_certificate((SSL_CTX *)ssl_ctx,x);
      if (iVar1 == 1) {
        bio_cert._4_4_ = 0;
        SSL_CTX_ctrl((SSL_CTX *)ssl_ctx,0x53,0,(void *)0x0);
        do {
          a = PEM_read_bio_X509(bp,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
          if (a == (X509 *)0x0) goto LAB_001512e8;
          lVar2 = SSL_CTX_ctrl((SSL_CTX *)ssl_ctx,0xe,0,a);
        } while (lVar2 == 1);
        X509_free(a);
        bio_cert._4_4_ = 0x5e;
LAB_001512e8:
        if (bio_cert._4_4_ != 0) {
          errcode = ERR_peek_last_error();
          iVar1 = ERR_GET_LIB(errcode);
          if ((iVar1 == 9) && (iVar1 = ERR_GET_REASON(errcode), iVar1 == 0x6c)) {
            ERR_clear_error();
            bio_cert._4_4_ = 0;
          }
          else {
            bio_cert._4_4_ = 0x6d;
          }
        }
      }
      else {
        log_ERR_get_error("Failure PEM_read_bio_X509_AUX");
        bio_cert._4_4_ = 0x45;
      }
      X509_free(x);
    }
    BIO_free(bp);
  }
  return bio_cert._4_4_;
}

Assistant:

static int load_certificate_chain(SSL_CTX* ssl_ctx, const char* certificate)
{
    int result;
    BIO* bio_cert;
    X509* x509_value;

    if ((bio_cert = BIO_new_mem_buf((char*)certificate, -1)) == NULL)
    {
        log_ERR_get_error("cannot create BIO");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_X509_OPENSSL_07_005: [ x509_openssl_add_ecc_credentials shall load the cert chain by calling PEM_read_bio_X509_AUX and SSL_CTX_use_certification. ] */
        if ((x509_value = PEM_read_bio_X509_AUX(bio_cert, NULL, NULL, NULL)) == NULL)
        {
            log_ERR_get_error("Failure PEM_read_bio_X509_AUX");
            result = MU_FAILURE;
        }
        else
        {
            if (SSL_CTX_use_certificate(ssl_ctx, x509_value) != 1)
            {
                log_ERR_get_error("Failure PEM_read_bio_X509_AUX");
                result = MU_FAILURE;
            }
            else
            {
                X509* ca_chain;

                result = 0;
                // If we could set up our certificate, now proceed to the CA
                // certificates.

                /* Codes_SRS_X509_OPENSSL_07_006: [ If successful x509_openssl_add_ecc_credentials shall to import each certificate in the cert chain. ] */
#if (OPENSSL_VERSION_NUMBER >= 0x10100000L) || defined(LIBRESSL_VERSION_NUMBER)
                SSL_CTX_clear_extra_chain_certs(ssl_ctx);
#else
                if (ssl_ctx->extra_certs != NULL)
                {
                    sk_X509_pop_free(ssl_ctx->extra_certs, X509_free);
                    ssl_ctx->extra_certs = NULL;
                }
#endif
                while ((ca_chain = PEM_read_bio_X509(bio_cert, NULL, NULL, NULL)) != NULL)
                {
                    if (SSL_CTX_add_extra_chain_cert(ssl_ctx, ca_chain) != 1)
                    {
                        X509_free(ca_chain);
                        result = MU_FAILURE;
                        break;
                    }
                }
                if (result != 0)
                {
                    // When the while loop ends, it's usually just EOF.
                    unsigned long err_value = ERR_peek_last_error();
                    if (ERR_GET_LIB(err_value) == ERR_LIB_PEM && ERR_GET_REASON(err_value) == PEM_R_NO_START_LINE)
                    {
                        ERR_clear_error();
                        result = 0;
                    }
                    else
                    {
                        result = MU_FAILURE;
                    }
                }
            }
            X509_free(x509_value);
        }
        BIO_free(bio_cert);
    }
    /* Codes_SRS_X509_OPENSSL_07_007: [ If any failure is encountered x509_openssl_add_ecc_credentials shall return a non-zero value. ] */
    return result;
}